

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O3

void __thiscall
asio::detail::
read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
::operator()(read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *pbVar1;
  non_const_lvalue<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>
  handler2;
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  int local_20 [2];
  error_category *local_18;
  mutable_buffers_1 local_10;
  
  local_18 = ec._M_cat;
  local_20[0] = ec._M_value;
  this->start_ = start;
  if (start == 1) {
    uVar2 = (ulong)(local_20[0] == 0) << 0x10;
    pvVar3 = (void *)(this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_
                     .super_mutable_buffer.size_;
    local_10.super_mutable_buffer.data_ =
         (void *)(this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.
                 total_consumed_;
  }
  else {
    pvVar3 = (void *)(this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_
                     .super_mutable_buffer.size_;
    local_10.super_mutable_buffer.data_ =
         (void *)((this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.
                  total_consumed_ + bytes_transferred);
    (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.total_consumed_ =
         (size_t)local_10.super_mutable_buffer.data_;
    if ((pvVar3 <= local_10.super_mutable_buffer.data_ || local_20[0] == 0 && bytes_transferred == 0
        ) || local_20[0] != 0) {
      std::
      __invoke_impl<void,void(nuraft::rpc_session::*&)(std::shared_ptr<nuraft::buffer>,std::error_code_const&,unsigned_long),std::shared_ptr<nuraft::rpc_session>&,std::shared_ptr<nuraft::buffer>&,std::error_code_const&,unsigned_long_const&>
                (&this->handler_,
                 &(this->handler_)._M_bound_args.
                  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                  .super__Head_base<0UL,_std::shared_ptr<nuraft::rpc_session>,_false>,
                 &(this->handler_)._M_bound_args,local_20);
      return;
    }
    uVar2 = 0x10000;
  }
  pvVar4 = local_10.super_mutable_buffer.data_;
  if (pvVar3 < local_10.super_mutable_buffer.data_) {
    pvVar4 = pvVar3;
  }
  local_10.super_mutable_buffer.data_ =
       (void *)((long)pvVar4 +
               (long)(this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_
                     .super_mutable_buffer.data_);
  local_10.super_mutable_buffer.size_ = (long)pvVar3 - (long)pvVar4;
  if (uVar2 <= (ulong)((long)pvVar3 - (long)pvVar4)) {
    local_10.super_mutable_buffer.size_ = uVar2;
  }
  pbVar1 = this->stream_;
  reactive_socket_service_base::
  async_receive<asio::mutable_buffers_1,asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,std::error_code_const&,unsigned_long)>>,asio::any_io_executor>
            (&((pbVar1->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.service_)->
              super_reactive_socket_service_base,
             &(pbVar1->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.
              implementation_.super_base_implementation_type,&local_10,0,this,
             &(pbVar1->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.executor_);
  return;
}

Assistant:

void operator()(asio::error_code ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, buffers_.total_consumed());
        for (;;)
        {
          {
            ASIO_HANDLER_LOCATION((__FILE__, __LINE__, "async_read"));
            stream_.async_read_some(buffers_.prepare(max_size),
                ASIO_MOVE_CAST(read_op)(*this));
          }
          return; default:
          buffers_.consume(bytes_transferred);
          if ((!ec && bytes_transferred == 0) || buffers_.empty())
            break;
          max_size = this->check_for_completion(ec, buffers_.total_consumed());
          if (max_size == 0)
            break;
          if (this->cancelled() != cancellation_type::none)
          {
            ec = error::operation_aborted;
            break;
          }
        }

        ASIO_MOVE_OR_LVALUE(ReadHandler)(handler_)(
            static_cast<const asio::error_code&>(ec),
            static_cast<const std::size_t&>(buffers_.total_consumed()));
      }
    }